

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeRowSingleton
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *row,int *i)

{
  int *piVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  bool bVar8;
  type_conflict5 tVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  long lVar13;
  double *pdVar14;
  RowSingletonPS *__p;
  long lVar15;
  long lVar16;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar17;
  uint *puVar18;
  pointer pnVar19;
  pointer pnVar20;
  pointer pnVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  undefined4 *puVar25;
  byte bVar26;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_fd8;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_f30;
  cpp_dec_float<200U,_int,_void> local_eb0;
  cpp_dec_float<200U,_int,_void> local_e30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  uint local_d30 [28];
  int local_cc0;
  undefined1 local_cbc;
  fpclass_type local_cb8;
  int32_t local_cb4;
  uint local_cb0 [28];
  int local_c40;
  undefined1 local_c3c;
  undefined8 local_c38;
  undefined4 local_c30 [28];
  int local_bc0;
  undefined1 local_bbc;
  undefined8 local_bb8;
  undefined4 local_bb0 [28];
  int local_b40;
  undefined1 local_b3c;
  undefined8 local_b38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ab0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_930;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_830;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_730;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  cpp_dec_float<200U,_int,_void> local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  cpp_dec_float<200U,_int,_void> local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  cpp_dec_float<200U,_int,_void> local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar26 = 0;
  pNVar7 = row->m_elem;
  pNVar17 = pNVar7;
  puVar18 = (uint *)&aij;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar18 = (pNVar17->val).m_backend.data._M_elems[0];
    pNVar17 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pNVar17->val).m_backend.data._M_elems + 1);
    puVar18 = puVar18 + 1;
  }
  iVar2 = (pNVar7->val).m_backend.exp;
  bVar10 = (pNVar7->val).m_backend.neg;
  fVar3 = (pNVar7->val).m_backend.fpclass;
  iVar4 = (pNVar7->val).m_backend.prec_elem;
  lVar13 = (long)pNVar7->idx;
  aij.m_backend.exp = iVar2;
  aij.m_backend.neg = bVar10;
  aij.m_backend.fpclass = fVar3;
  aij.m_backend.prec_elem = iVar4;
  pdVar14 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_eb0,-*pdVar14,(type *)0x0);
  pdVar14 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_f30,*pdVar14,(type *)0x0);
  puVar18 = (uint *)&aij;
  pnVar22 = &local_b0;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pnVar22->m_backend).data._M_elems[0] = *puVar18;
    puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = iVar2;
  local_b0.m_backend.neg = bVar10;
  local_b0.m_backend.fpclass = fVar3;
  local_b0.m_backend.prec_elem = iVar4;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_130,0.0,(type *)0x0);
  epsZero(&local_1b0,this);
  bVar8 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_130,&local_1b0);
  if (bVar8) {
    iVar2 = *i;
    pnVar20 = (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar14 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_e30,-*pdVar14,(type *)0x0);
    tVar9 = boost::multiprecision::operator<=
                      (pnVar20 + iVar2,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_e30);
    if (tVar9) {
      pdVar14 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar14,(type *)0x0);
    }
    else {
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,
                 &(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*i].m_backend,&aij.m_backend);
    }
    pnVar22 = &result;
    pcVar23 = &local_eb0;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pcVar23->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
      pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
      pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar26 * -2 + 1) * 4);
    }
    local_eb0.exp = result.m_backend.exp;
    local_eb0.neg = result.m_backend.neg;
    local_eb0.fpclass = result.m_backend.fpclass;
    local_eb0.prec_elem = result.m_backend.prec_elem;
    iVar2 = *i;
    pnVar20 = (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar14 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_e30,*pdVar14,(type *)0x0);
    tVar9 = boost::multiprecision::operator>=
                      (pnVar20 + iVar2,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_e30);
    if (tVar9) goto LAB_004165a4;
    pcVar23 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
LAB_004165d7:
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x1c;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems[0x18] = 0;
    result.m_backend.data._M_elems[0x19] = 0;
    result.m_backend.data._M_elems._104_5_ = 0;
    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result.m_backend,pcVar23,&aij.m_backend);
  }
  else {
    pnVar22 = &aij;
    pnVar24 = &local_230;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pnVar24->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
      pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
      pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar24 + ((ulong)bVar26 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = iVar2;
    local_230.m_backend.neg = bVar10;
    local_230.m_backend.fpclass = fVar3;
    local_230.m_backend.prec_elem = iVar4;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_2b0,0.0,(type *)0x0);
    epsZero(&local_330,this);
    bVar10 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_230,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_2b0,&local_330);
    if (!bVar10) {
      iVar2 = *i;
      pnVar20 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar21 = pnVar20 + iVar2;
      pnVar22 = &local_3b0;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar22->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
        pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar26 * -2 + 1) * 4);
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
      }
      local_3b0.m_backend.exp = pnVar20[iVar2].m_backend.exp;
      local_3b0.m_backend.neg = pnVar20[iVar2].m_backend.neg;
      local_3b0.m_backend.fpclass = pnVar20[iVar2].m_backend.fpclass;
      local_3b0.m_backend.prec_elem = pnVar20[iVar2].m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_430,0.0,(type *)0x0);
      feastol(&local_4b0,this);
      bVar10 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_3b0,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_430,&local_4b0);
      if (bVar10) {
        return INFEASIBLE;
      }
      iVar2 = *i;
      pnVar20 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar21 = pnVar20 + iVar2;
      pnVar22 = &local_530;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar22->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
        pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar26 * -2 + 1) * 4);
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
      }
      local_530.m_backend.exp = pnVar20[iVar2].m_backend.exp;
      local_530.m_backend.neg = pnVar20[iVar2].m_backend.neg;
      local_530.m_backend.fpclass = pnVar20[iVar2].m_backend.fpclass;
      local_530.m_backend.prec_elem = pnVar20[iVar2].m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_5b0,0.0,(type *)0x0);
      feastol(&local_630,this);
      bVar10 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_530,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_5b0,&local_630);
      if (bVar10) {
        return INFEASIBLE;
      }
      goto LAB_00416636;
    }
    iVar2 = *i;
    pnVar20 = (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar14 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_e30,*pdVar14,(type *)0x0);
    tVar9 = boost::multiprecision::operator>=
                      (pnVar20 + iVar2,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_e30);
    if (tVar9) {
      pdVar14 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar14,(type *)0x0);
    }
    else {
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,
                 &(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*i].m_backend,&aij.m_backend);
    }
    pnVar22 = &result;
    pcVar23 = &local_eb0;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pcVar23->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
      pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
      pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar26 * -2 + 1) * 4);
    }
    local_eb0.exp = result.m_backend.exp;
    local_eb0.neg = result.m_backend.neg;
    local_eb0.fpclass = result.m_backend.fpclass;
    local_eb0.prec_elem = result.m_backend.prec_elem;
    iVar2 = *i;
    pnVar20 = (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar14 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_e30,-*pdVar14,(type *)0x0);
    tVar9 = boost::multiprecision::operator<=
                      (pnVar20 + iVar2,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_e30);
    if (!tVar9) {
      pcVar23 = &(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
      goto LAB_004165d7;
    }
LAB_004165a4:
    pdVar14 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,*pdVar14,(type *)0x0);
  }
  pnVar22 = &result;
  pcVar23 = &local_f30;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pcVar23->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar26 * -2 + 1) * 4);
  }
  local_f30.exp = result.m_backend.exp;
  local_f30.neg = result.m_backend.neg;
  local_f30.fpclass = result.m_backend.fpclass;
  local_f30.prec_elem = result.m_backend.prec_elem;
LAB_00416636:
  pcVar23 = &local_eb0;
  pnVar22 = &local_6b0;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pnVar22->m_backend).data._M_elems[0] = (pcVar23->data)._M_elems[0];
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar26 * -2 + 1) * 4);
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
  }
  local_6b0.m_backend.exp = local_eb0.exp;
  local_6b0.m_backend.neg = local_eb0.neg;
  local_6b0.m_backend.fpclass = local_eb0.fpclass;
  local_6b0.m_backend.prec_elem = local_eb0.prec_elem;
  epsZero(&local_730,this);
  bVar10 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_6b0,&local_730);
  if (bVar10) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_eb0,0.0);
  }
  pcVar23 = &local_f30;
  pnVar22 = &local_7b0;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pnVar22->m_backend).data._M_elems[0] = (pcVar23->data)._M_elems[0];
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar26 * -2 + 1) * 4);
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
  }
  local_7b0.m_backend.exp = local_f30.exp;
  local_7b0.m_backend.neg = local_f30.neg;
  local_7b0.m_backend.fpclass = local_f30.fpclass;
  local_7b0.m_backend.prec_elem = local_f30.prec_elem;
  epsZero(&local_830,this);
  bVar10 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_7b0,&local_830);
  if (bVar10) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_f30,0.0);
  }
  pnVar20 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).low.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pnVar21 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).up.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar15 = 0x1c;
  pnVar19 = pnVar20 + lVar13;
  pnVar22 = &result;
  for (lVar16 = lVar15; lVar16 != 0; lVar16 = lVar16 + -1) {
    (pnVar22->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
    pnVar19 = (pointer)((long)pnVar19 + ((ulong)bVar26 * -2 + 1) * 4);
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
  }
  iVar2 = pnVar20[lVar13].m_backend.exp;
  bVar10 = pnVar20[lVar13].m_backend.neg;
  local_fc8._0_4_ = pnVar20[lVar13].m_backend.fpclass;
  local_fc8._4_4_ = pnVar20[lVar13].m_backend.prec_elem;
  uStack_fc0 = 0;
  pnVar20 = pnVar21 + lVar13;
  pcVar23 = &local_e30;
  for (lVar16 = lVar15; lVar16 != 0; lVar16 = lVar16 + -1) {
    (pcVar23->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
    pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar26 * -2 + 1) * 4);
  }
  iVar5 = pnVar21[lVar13].m_backend.exp;
  bVar8 = pnVar21[lVar13].m_backend.neg;
  fVar3 = pnVar21[lVar13].m_backend.fpclass;
  iVar4 = pnVar21[lVar13].m_backend.prec_elem;
  pcVar23 = &local_f30;
  pnVar22 = &local_8b0;
  for (lVar16 = lVar15; lVar16 != 0; lVar16 = lVar16 + -1) {
    (pnVar22->m_backend).data._M_elems[0] = (pcVar23->data)._M_elems[0];
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar26 * -2 + 1) * 4);
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
  }
  local_8b0.m_backend.exp = local_f30.exp;
  local_8b0.m_backend.neg = local_f30.neg;
  local_8b0.m_backend.fpclass = local_f30.fpclass;
  local_8b0.m_backend.prec_elem = local_f30.prec_elem;
  pnVar20 = pnVar21 + lVar13;
  pnVar22 = &local_930;
  for (; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pnVar22->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
    pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
  }
  local_930.m_backend.exp = iVar5;
  local_930.m_backend.neg = bVar8;
  local_930.m_backend.fpclass = fVar3;
  local_930.m_backend.prec_elem = iVar4;
  feastol(&local_9b0,this);
  bVar11 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_8b0,&local_930,&local_9b0);
  if (bVar11) {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2d])(lp,lVar13,&local_f30,0);
  }
  lVar15 = 0x1c;
  pcVar23 = &local_eb0;
  pnVar22 = &local_a30;
  for (lVar16 = lVar15; lVar16 != 0; lVar16 = lVar16 + -1) {
    (pnVar22->m_backend).data._M_elems[0] = (pcVar23->data)._M_elems[0];
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar26 * -2 + 1) * 4);
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
  }
  local_a30.m_backend.exp = local_eb0.exp;
  local_a30.m_backend.neg = local_eb0.neg;
  local_a30.m_backend.fpclass = local_eb0.fpclass;
  local_a30.m_backend.prec_elem = local_eb0.prec_elem;
  pnVar20 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).low.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pnVar21 = pnVar20 + lVar13;
  pnVar22 = &local_ab0;
  for (; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pnVar22->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
    pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar26 * -2 + 1) * 4);
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
  }
  local_ab0.m_backend.exp = pnVar20[lVar13].m_backend.exp;
  local_ab0.m_backend.neg = pnVar20[lVar13].m_backend.neg;
  local_ab0.m_backend.fpclass = pnVar20[lVar13].m_backend.fpclass;
  local_ab0.m_backend.prec_elem = pnVar20[lVar13].m_backend.prec_elem;
  feastol(&local_b30,this);
  bVar12 = GTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_a30,&local_ab0,&local_b30);
  if (bVar12) {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(lp,lVar13,&local_eb0,0);
  }
  __p = (RowSingletonPS *)operator_new(0x458);
  iVar6 = *i;
  pnVar20 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).low.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar15 = 0x1c;
  pnVar21 = pnVar20 + lVar13;
  puVar25 = local_bb0;
  for (lVar16 = lVar15; lVar16 != 0; lVar16 = lVar16 + -1) {
    *puVar25 = (pnVar21->m_backend).data._M_elems[0];
    pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar26 * -2 + 1) * 4);
    puVar25 = puVar25 + (ulong)bVar26 * -2 + 1;
  }
  local_b40 = pnVar20[lVar13].m_backend.exp;
  local_b3c = pnVar20[lVar13].m_backend.neg;
  local_b38._0_4_ = pnVar20[lVar13].m_backend.fpclass;
  local_b38._4_4_ = pnVar20[lVar13].m_backend.prec_elem;
  pnVar20 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).up.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pnVar21 = pnVar20 + lVar13;
  puVar25 = local_c30;
  for (lVar16 = lVar15; lVar16 != 0; lVar16 = lVar16 + -1) {
    *puVar25 = (pnVar21->m_backend).data._M_elems[0];
    pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar26 * -2 + 1) * 4);
    puVar25 = puVar25 + (ulong)bVar26 * -2 + 1;
  }
  local_bc0 = pnVar20[lVar13].m_backend.exp;
  local_bbc = pnVar20[lVar13].m_backend.neg;
  local_bb8._0_4_ = pnVar20[lVar13].m_backend.fpclass;
  local_bb8._4_4_ = pnVar20[lVar13].m_backend.prec_elem;
  pnVar22 = &result;
  puVar18 = local_cb0;
  for (lVar16 = lVar15; lVar16 != 0; lVar16 = lVar16 + -1) {
    *puVar18 = (pnVar22->m_backend).data._M_elems[0];
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
    puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
  }
  local_c40 = iVar2;
  local_c3c = bVar10;
  local_c38 = local_fc8;
  pcVar23 = &local_e30;
  puVar18 = local_d30;
  for (; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar18 = (pcVar23->data)._M_elems[0];
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar26 * -2 + 1) * 4);
    puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
  }
  local_cc0 = iVar5;
  local_cbc = bVar8;
  local_cb8 = fVar3;
  local_cb4 = iVar4;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_fd8,
             &(this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  RowSingletonPS::RowSingletonPS
            (__p,lp,iVar6,lVar13,bVar12,bVar11,local_bb0,local_c30,local_cb0,local_d30,&local_fd8);
  std::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::RowSingletonPS,void>
            ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
              *)&ptr,__p);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_fd8._M_refcount);
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(this->m_hist).data,&ptr);
  removeRow(this,lp,*i);
  piVar1 = &(this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).m_remRows;
  *piVar1 = *piVar1 + 1;
  piVar1 = &(this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).m_remNzos;
  *piVar1 = *piVar1 + 1;
  piVar1 = (this->m_stat).data + 2;
  *piVar1 = *piVar1 + 1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeRowSingleton(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 1);

   R aij = row.value(0);
   int  j   = row.index(0);
   R lo  = R(-infinity);
   R up  =  R(infinity);

   SPxOut::debug(this, "IMAISM22 row {}: singleton -> val={} lhs={} rhs={}", i, aij, lp.lhs(i),
                 lp.rhs(i));

   if(GT(aij, R(0.0), this->epsZero()))            // aij > 0
   {
      lo = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) / aij;
      up = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) / aij;
   }
   else if(LT(aij, R(0.0), this->epsZero()))       // aij < 0
   {
      lo = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) / aij;
      up = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) / aij;
   }
   else if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
   {
      // aij == 0, rhs < 0 or lhs > 0
      SPxOut::debug(this, " infeasible\n");
      return this->INFEASIBLE;
   }

   if(isZero(lo, this->epsZero()))
      lo = 0.0;

   if(isZero(up, this->epsZero()))
      up = 0.0;

   SPxOut::debug(this, " removed, lower={} ({}) upper={} ({})\n", lo, lp.lower(j), up, lp.upper(j));

   bool stricterUp = false;
   bool stricterLo = false;

   R oldLo = lp.lower(j);
   R oldUp = lp.upper(j);

   if(LTrel(up, lp.upper(j), feastol()))
   {
      lp.changeUpper(j, up);
      stricterUp = true;
   }

   if(GTrel(lo, lp.lower(j), feastol()))
   {
      lp.changeLower(j, lo);
      stricterLo = true;
   }

   std::shared_ptr<PostStep> ptr(new RowSingletonPS(lp, i, j, stricterLo, stricterUp,
                                 lp.lower(j),
                                 lp.upper(j), oldLo, oldUp, this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);

   this->m_remRows++;
   this->m_remNzos++;
   ++m_stat[SINGLETON_ROW];

   return this->OKAY;
}